

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
visit_null(basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
           *this,semantic_tag param_1,ser_context *param_2,error_code *param_3)

{
  size_t *psVar1;
  pointer peVar2;
  
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((((this->stack_).
        super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
        ._M_impl.super__Vector_impl_data._M_start != peVar2) && (peVar2[-1].type_ == array)) &&
     (peVar2[-1].count_ != 0)) {
    stream_sink<char>::push_back(&this->sink_,',');
  }
  stream_sink<char>::append
            (&this->sink_,
             "nulltruefalseN5Catch10BinaryExprIRKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEERKSt17basic_string_viewIcS4_EEE"
             ,4);
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar2) {
    psVar1 = &peVar2[-1].count_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_null(semantic_tag, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            sink_.append(null_constant().data(), null_constant().size());

            if (!stack_.empty())
            {
                stack_.back().increment_count();
            }
            JSONCONS_VISITOR_RETURN;
        }